

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::RedirectedStdOut::RedirectedStdOut(RedirectedStdOut *this)

{
  ReusableStringStream::ReusableStringStream(&this->m_rss);
  RedirectedStream::RedirectedStream(&this->m_cout,(ostream *)&std::cout,(this->m_rss).m_oss);
  return;
}

Assistant:

RedirectedStdOut::RedirectedStdOut() : m_cout( Catch::cout(), m_rss.get() ) {}